

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

bool __thiscall wirehair::Codec::TriangleNonHeavy(Codec *this)

{
  ulong uVar1;
  ulong *puVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint16_t *puVar7;
  uint64_t *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint end;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ushort *puVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  bool bVar22;
  
  uVar12 = this->_next_pivot;
  uVar21 = (ulong)uVar12;
  uVar4 = this->_first_heavy_column;
  if (uVar12 < uVar4) {
    uVar5 = this->_pivot_count;
    puVar7 = this->_pivots;
    uVar6 = this->_ge_pitch;
    uVar17 = 1L << (uVar21 & 0x3f);
    puVar8 = this->_ge_matrix;
    uVar11 = (ulong)uVar5;
    if (uVar5 < uVar12) {
      uVar11 = (ulong)uVar12;
    }
    bVar22 = false;
    uVar14 = uVar21;
    do {
      if (uVar14 == uVar11) {
LAB_001041a0:
        this->_next_pivot = (uint)uVar11;
        return bVar22;
      }
      puVar18 = puVar7 + uVar21;
      uVar10 = uVar14 >> 6 & 0x3ffffff;
      uVar1 = uVar14 + 1;
      uVar15 = uVar14 & 0xffffffff;
      uVar20 = ((uint)uVar21 >> 6) << 3;
      uVar12 = uVar6 - (int)uVar10;
      uVar19 = uVar1;
      while( true ) {
        uVar3 = *puVar18;
        uVar13 = (ulong)(uVar3 * uVar6);
        uVar9 = puVar8[uVar10 + uVar13];
        if ((uVar9 & uVar17) != 0) break;
        uVar16 = (int)uVar15 + 1;
        uVar15 = (ulong)uVar16;
        uVar19 = uVar19 + 1;
        puVar18 = puVar18 + 1;
        if (uVar5 <= uVar16) {
          uVar11 = uVar14 & 0xffffffff;
          goto LAB_001041a0;
        }
      }
      *puVar18 = puVar7[uVar14];
      puVar7[uVar14] = uVar3;
      if ((int)uVar15 + 1U < uVar5) {
        do {
          uVar14 = (ulong)(puVar7[uVar19] * uVar6);
          if (((puVar8[uVar10 + uVar14] & uVar17) != 0) &&
             (puVar8[uVar10 + uVar14] = puVar8[uVar10 + uVar14] ^ uVar9 & -uVar17 ^ uVar17,
             1 < uVar12)) {
            uVar15 = 1;
            do {
              puVar2 = (ulong *)((long)puVar8 + uVar15 * 8 + uVar14 * 8 + (ulong)uVar20);
              *puVar2 = *puVar2 ^ *(ulong *)((long)puVar8 + uVar15 * 8 + uVar13 * 8 + (ulong)uVar20)
              ;
              uVar15 = uVar15 + 1;
            } while (uVar15 < uVar12);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 < uVar5);
      }
      uVar17 = uVar17 >> 0x3f | uVar17 << 1;
      uVar21 = (ulong)((uint)uVar21 + 1);
      bVar22 = uVar4 <= uVar1;
      uVar14 = uVar1;
      uVar12 = uVar4;
    } while (uVar1 != uVar4);
  }
  this->_next_pivot = uVar12;
  InsertHeavyRows(this);
  return true;
}

Assistant:

bool Codec::TriangleNonHeavy()
{
    CAT_IF_DUMP(cout << endl << "---- TriangleNonHeavy ----" << endl << endl;)

    const unsigned pivot_count = _pivot_count;
    const unsigned first_heavy_column = _first_heavy_column;

    unsigned pivot_i = _next_pivot;
    uint64_t ge_mask = (uint64_t)1 << (pivot_i & 63);

    // For the columns that are not protected by heavy rows:
    for (; pivot_i < first_heavy_column; ++pivot_i)
    {
        const unsigned word_offset = pivot_i >> 6;

        bool found = false;

        uint64_t * GF256_RESTRICT ge_matrix_offset = _ge_matrix + word_offset;

        // For each remaining GE row that might be the pivot:
        for (unsigned pivot_j = pivot_i; pivot_j < pivot_count; ++pivot_j)
        {
            // Determine if the row contains the bit we want
            const unsigned ge_row_j = _pivots[pivot_j];

            uint64_t * GF256_RESTRICT ge_row = &ge_matrix_offset[_ge_pitch * ge_row_j];

            // If the bit was not found:
            if (0 == (*ge_row & ge_mask)) {
                continue; // Skip to next
            }

            // Found it!
            found = true;

            CAT_IF_DUMP(cout << "Pivot " << pivot_i << " found on row " << ge_row_j << endl;)

            // Swap out the pivot index for this one
            _pivots[pivot_j] = _pivots[pivot_i];
            CAT_DEBUG_ASSERT(ge_row_j < _pivot_count);
            _pivots[pivot_i] = (uint16_t)ge_row_j;

            // Prepare masked first word
            const uint64_t row0 = (*ge_row & ~(ge_mask - 1)) ^ ge_mask;

            // For each remaining unused row:
            for (unsigned pivot_k = pivot_j + 1; pivot_k < pivot_count; ++pivot_k)
            {
                // Determine if the row contains the bit we want
                const unsigned ge_row_k = _pivots[pivot_k];

                uint64_t * GF256_RESTRICT rem_row = &ge_matrix_offset[_ge_pitch * ge_row_k];

                // If the bit was found:
                if (0 != (*rem_row & ge_mask))
                {
                    // Unroll first word to handle masked word and for speed
                    *rem_row ^= row0;

                    // Add the pivot row to eliminate the bit from this row, preserving previous bits
                    for (unsigned ii = 1, end = _ge_pitch - word_offset; ii < end; ++ii) {
                        rem_row[ii] ^= ge_row[ii];
                    }
                }
            } // next remaining row

            break;
        }

        // If pivot could not be found:
        if (!found)
        {
            _next_pivot = pivot_i;

            CAT_IF_DUMP(cout << "Singular: Pivot " << pivot_i << " of " <<
                (_defer_count + _mix_count) << " not found!" << endl;)

            CAT_IF_PIVOT(if (pivot_i + 16 < (unsigned)(_defer_count + _mix_count)) {
                cout << ">>>>> Singular: Pivot " << pivot_i << " of " <<
                    (_defer_count + _mix_count) << " not found!" << endl << endl;
            })

            return false;
        }

        // Generate next mask
        ge_mask = CAT_ROL64(ge_mask, 1);
    }

    _next_pivot = pivot_i;

    InsertHeavyRows();

    return true;
}